

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# euarel.cc
# Opt level: O3

string * OB::Euarel::url_encode(string *__return_storage_ptr__,string *str,bool form)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  long *plVar5;
  long *plVar6;
  char c;
  size_type sVar7;
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  string *local_38;
  
  local_60 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_38 = __return_storage_ptr__;
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  sVar2 = str->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (str->_M_dataplus)._M_p;
    sVar7 = 0;
    do {
      bVar1 = pcVar3[sVar7];
      if (bVar1 == 0x20 && form) {
        std::__cxx11::string::append((char *)local_38);
      }
      else {
        iVar4 = isalnum((uint)bVar1);
        if ((((iVar4 == 0) && (1 < bVar1 - 0x2d)) && (bVar1 != 0x7e)) && (bVar1 != 0x5f)) {
          hex_encode_abi_cxx11_(&local_80,(Euarel *)(ulong)(uint)(int)(char)bVar1,c);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x10962d);
          local_58 = &local_48;
          plVar6 = plVar5 + 2;
          if ((long *)*plVar5 == plVar6) {
            local_48 = *plVar6;
            lStack_40 = plVar5[3];
          }
          else {
            local_48 = *plVar6;
            local_58 = (long *)*plVar5;
          }
          local_50 = plVar5[1];
          *plVar5 = (long)plVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_38,(ulong)local_58);
          if (local_58 != &local_48) {
            operator_delete(local_58,local_48 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::string::push_back((char)local_38);
        }
      }
      sVar7 = sVar7 + 1;
    } while (sVar2 != sVar7);
  }
  return local_38;
}

Assistant:

std::string url_encode(std::string const& str, bool form)
{
  std::string res;
  res.reserve(str.size());

  for (auto const& e : str)
  {
    if (e == ' ' && form)
    {
      res += "+";
    }
    else if (std::isalnum(static_cast<unsigned char>(e)) ||
      e == '-' || e == '_' || e == '.' || e == '~')
    {
      res += e;
    }
    else
    {
      res += "%" + hex_encode(e);
    }
  }

  return res;
}